

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

QString * __thiscall QString::insert(QString *this,qsizetype i,QChar *unicode,qsizetype size)

{
  Data *pDVar1;
  char16_t *pcVar2;
  long lVar3;
  long in_FS_OFFSET;
  QVarLengthArray<QChar,_256LL> copy;
  back_insert_iterator<QVarLengthArray<QChar,_256LL>_> local_258;
  undefined1 local_250 [536];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < size && -1 < i) {
    pDVar1 = (this->d).d;
    if ((pDVar1 != (Data *)0x0) &&
       ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
      pcVar2 = (this->d).ptr;
      if ((QChar *)pcVar2 == (QChar *)0x0) {
        pcVar2 = L"";
      }
      if ((pcVar2 <= unicode) && (unicode < (QChar *)pcVar2 + (this->d).size)) {
        memset((QVarLengthArray<QChar,_256LL> *)local_250,0xaa,0x218);
        local_250._0_8_ = 0x100;
        local_250._8_8_ = (QChar *)0x0;
        local_250._16_8_ = local_250 + 0x18;
        if (0x100 < size) {
          QVLABase<QChar>::reallocate_impl
                    ((QVLABase<QChar> *)local_250,0x100,local_250 + 0x18,0,size);
        }
        local_258.container = (QVarLengthArray<QChar,_256LL> *)local_250;
        if (0 < size) {
          lVar3 = size + 1;
          do {
            std::back_insert_iterator<QVarLengthArray<QChar,_256LL>_>::operator=(&local_258,unicode)
            ;
            unicode = unicode + 1;
            lVar3 = lVar3 + -1;
          } while (1 < lVar3);
        }
        insert(this,i,(QChar *)local_250._16_8_,size);
        if ((QChar *)local_250._16_8_ != (QChar *)(local_250 + 0x18)) {
          QtPrivate::sizedFree((void *)local_250._16_8_,local_250._0_8_ * 2);
        }
        goto LAB_0032bf4a;
      }
    }
    local_250._0_8_ = size;
    local_250._8_8_ = unicode;
    insert_helper<QStringView>(this,i,(QStringView *)local_250);
  }
LAB_0032bf4a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QString& QString::insert(qsizetype i, const QChar *unicode, qsizetype size)
{
    if (i < 0 || size <= 0)
        return *this;

    // In case when data points into "this"
    if (!d->needsDetach() && QtPrivate::q_points_into_range(unicode, *this)) {
        QVarLengthArray copy(unicode, unicode + size);
        insert(i, copy.data(), size);
    } else {
        insert_helper(*this, i, QStringView(unicode, size));
    }

    return *this;
}